

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_connection.hpp
# Opt level: O2

void __thiscall cinatra::coro_http_connection::build_ws_handshake_head(coro_http_connection *this)

{
  uint8_t *puVar1;
  coro_http_response *this_00;
  string_view key;
  string_view sVar2;
  allocator<char> local_179;
  string_view protocal_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  char accept_key [29];
  uint8_t sha1buf [20];
  uint8_t key_src [60];
  sha1_context local_88;
  
  sVar2._M_str = "sec-websocket-key";
  sVar2._M_len = 0x11;
  sVar2 = coro_http_request::get_header_value(&this->request_,sVar2);
  puVar1 = (uint8_t *)sVar2._M_str;
  key_src._0_8_ = *(undefined8 *)puVar1;
  key_src._8_8_ = *(undefined8 *)(puVar1 + 8);
  key_src._16_8_ = *(undefined8 *)(puVar1 + 0x10);
  builtin_memcpy(key_src + 0x18,"258EAFA5-E914-47DA-95CA-C5AB0DC85B11",0x24);
  local_88.buflen = 0;
  local_88.blocks = 0;
  local_88.digest[0] = 0x67452301;
  local_88.digest[1] = 0xefcdab89;
  local_88.digest[2] = 0x98badcfe;
  local_88.digest[3] = 0x10325476;
  local_88.digest[4] = 0xc3d2e1f0;
  update<void>(&local_88,key_src,0x3c);
  finish<void>(&local_88,sha1buf);
  code_utils::base64_encode(accept_key,sha1buf,0x14,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"",(allocator<char> *)&protocal_str);
  this_00 = &this->response_;
  coro_http_response::set_status_and_content
            (this_00,switching_protocols,&local_128,none,(string_view)(ZEXT816(0x13f451) << 0x40));
  std::__cxx11::string::~string((string *)&local_128);
  coro_http_response::add_header<char_const*,char_const*>(this_00,"Upgrade","WebSocket");
  coro_http_response::add_header<char_const*,char_const*>(this_00,"Connection","Upgrade");
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,accept_key,accept_key + 0x1c)
  ;
  coro_http_response::add_header<char_const*,std::__cxx11::string>
            (this_00,"Sec-WebSocket-Accept",&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  key._M_str = "sec-websocket-protocol";
  key._M_len = 0x16;
  protocal_str = coro_http_request::get_header_value(&this->request_,key);
  if (protocal_str._M_len != 0) {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_168,&protocal_str,&local_179);
    coro_http_response::add_header<char_const*,std::__cxx11::string>
              (this_00,"Sec-WebSocket-Protocol",&local_168);
    std::__cxx11::string::~string((string *)&local_168);
  }
  return;
}

Assistant:

void build_ws_handshake_head() {
    uint8_t sha1buf[20], key_src[60];
    char accept_key[29];

    std::memcpy(key_src, request_.get_header_value("sec-websocket-key").data(),
                24);
    std::memcpy(key_src + 24, ws_guid, 36);
    sha1_context ctx;
    init(ctx);
    update(ctx, key_src, sizeof(key_src));
    finish(ctx, sha1buf);

    code_utils::base64_encode(accept_key, sha1buf, sizeof(sha1buf), 0);

    response_.set_status_and_content(status_type::switching_protocols, "");

    response_.add_header("Upgrade", "WebSocket");
    response_.add_header("Connection", "Upgrade");
    response_.add_header("Sec-WebSocket-Accept", std::string(accept_key, 28));
    auto protocal_str = request_.get_header_value("sec-websocket-protocol");
#ifdef CINATRA_ENABLE_GZIP
    if (is_client_ws_compressed_) {
      response_.add_header("Sec-WebSocket-Extensions",
                           "permessage-deflate; client_no_context_takeover");
    }
#endif
    if (!protocal_str.empty()) {
      response_.add_header("Sec-WebSocket-Protocol", std::string(protocal_str));
    }
  }